

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

FBaseCVar * FindCVar(char *var_name,FBaseCVar **prev)

{
  int iVar1;
  FBaseCVar *pFVar2;
  
  pFVar2 = CVars;
  if (var_name == (char *)0x0) {
    pFVar2 = (FBaseCVar *)0x0;
  }
  else {
    if (prev != (FBaseCVar **)0x0) {
      *prev = (FBaseCVar *)0x0;
    }
    while ((pFVar2 != (FBaseCVar *)0x0 && (iVar1 = strcasecmp(pFVar2->Name,var_name), iVar1 != 0)))
    {
      if (prev != (FBaseCVar **)0x0) {
        *prev = pFVar2;
      }
      pFVar2 = pFVar2->m_Next;
    }
  }
  return pFVar2;
}

Assistant:

FBaseCVar *FindCVar (const char *var_name, FBaseCVar **prev)
{
	FBaseCVar *var;
	FBaseCVar *dummy;

	if (var_name == NULL)
		return NULL;

	if (prev == NULL)
		prev = &dummy;

	var = CVars;
	*prev = NULL;
	while (var)
	{
		if (stricmp (var->GetName (), var_name) == 0)
			break;
		*prev = var;
		var = var->m_Next;
	}
	return var;
}